

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::
Unser<ParamsStream<BufferedFile&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<BufferedFile_&,_TransactionSerParams> *s,
          vector<CTxIn,_std::allocator<CTxIn>_> *v)

{
  long lVar1;
  pointer pCVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint64_t __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::_M_erase_at_end
            (v,(v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
               super__Vector_impl_data._M_start);
  uVar3 = ReadCompactSize<ParamsStream<BufferedFile&,TransactionSerParams>>(s,true);
  if (uVar3 != 0) {
    __n = 0;
    do {
      uVar4 = __n + 0xbbcc;
      __n = uVar3;
      if (uVar4 < uVar3) {
        __n = uVar4;
      }
      std::vector<CTxIn,_std::allocator<CTxIn>_>::reserve(v,__n);
      while ((ulong)(((long)(v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5) < __n) {
        std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<>(v);
        pCVar2 = (v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        ActionUnserialize::
        SerReadWriteMany<ParamsStream<BufferedFile&,TransactionSerParams>,COutPoint&,CScript&,unsigned_int&>
                  (s,&pCVar2[-1].prevout,&pCVar2[-1].scriptSig,&pCVar2[-1].nSequence);
      }
    } while (uVar4 < uVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }